

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.cc
# Opt level: O2

int bf_ecb_cipher(EVP_CIPHER_CTX *ctx,uint8_t *out,uint8_t *in,size_t len)

{
  BF_KEY *key;
  
  key = (BF_KEY *)ctx->cipher_data;
  for (; 7 < len; len = len - 8) {
    BF_ecb_encrypt(in,out,key,ctx->encrypt);
    in = in + 8;
    out = out + 8;
  }
  if (len == 0) {
    return 1;
  }
  __assert_fail("len == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish.cc"
                ,0x216,"int bf_ecb_cipher(EVP_CIPHER_CTX *, uint8_t *, const uint8_t *, size_t)");
}

Assistant:

static int bf_ecb_cipher(EVP_CIPHER_CTX *ctx, uint8_t *out, const uint8_t *in,
                         size_t len) {
  BF_KEY *bf_key = reinterpret_cast<BF_KEY *>(ctx->cipher_data);

  while (len >= BF_BLOCK) {
    BF_ecb_encrypt(in, out, bf_key, ctx->encrypt);
    in += BF_BLOCK;
    out += BF_BLOCK;
    len -= BF_BLOCK;
  }
  assert(len == 0);

  return 1;
}